

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int server_finish_handshake
              (ptls_t *tls,ptls_message_emitter_t *emitter,int send_cert_verify,
              st_ptls_signature_algorithms_t *signature_algorithms)

{
  size_t *psVar1;
  ushort uVar2;
  uint uVar3;
  ptls_context_t *ppVar4;
  ptls_buffer_t *ppVar5;
  ptls_key_schedule_t *ppVar6;
  char *__s;
  ptls_buffer_t *ppVar7;
  st_ptls_encrypt_ticket_t *psVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  uint uVar13;
  char *src;
  int iVar14;
  int iVar15;
  int iVar16;
  st_ptls_hash_context_t *psVar17;
  uint64_t uVar18;
  ulong uVar19;
  size_t sVar20;
  long lVar21;
  anon_struct_208_2_4e55c0bb_for_traffic_protection *secret;
  size_t sVar22;
  uint8_t *puVar23;
  byte bVar24;
  anon_struct_40_2_b6104b7a_for_ech *paVar25;
  size_t sVar26;
  size_t sVar27;
  ptls_hash_context_t **pppVar28;
  bool bVar29;
  ptls_iovec_t pVar30;
  ptls_buffer_t session_id;
  uint16_t _v;
  uint32_t _v_1;
  char session_id_smallbuf [128];
  int local_140;
  ptls_buffer_t local_138;
  ptls_context_t *local_110;
  uint8_t *local_108;
  ptls_key_schedule_t *local_100;
  uint local_f4;
  char *local_f0;
  size_t local_e8;
  size_t local_e0;
  uint8_t *local_d8;
  size_t local_d0;
  anon_struct_208_2_4e55c0bb_for_traffic_protection *local_c8;
  st_ptls_hash_context_t *local_c0;
  uint8_t local_b8 [136];
  
  if ((send_cert_verify != 0) &&
     (iVar14 = send_certificate_verify
                         (tls,emitter,signature_algorithms,"TLS 1.3, server CertificateVerify"),
     iVar14 != 0)) {
    if (iVar14 != 0x20b) {
      return iVar14;
    }
    tls->state = PTLS_STATE_SERVER_GENERATING_CERTIFICATE_VERIFY;
    return 0x20b;
  }
  iVar14 = send_finished(tls,emitter);
  if (iVar14 != 0) {
    return iVar14;
  }
  if (tls->key_schedule->generation != 2) {
    __assert_fail("tls->key_schedule->generation == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x1336,
                  "int server_finish_handshake(ptls_t *, ptls_message_emitter_t *, int, struct st_ptls_signature_algorithms_t *)"
                 );
  }
  iVar14 = key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
  if (iVar14 != 0) {
    return iVar14;
  }
  iVar14 = setup_traffic_protection(tls,1,"s ap traffic",3,0,0);
  if (iVar14 != 0) {
    return iVar14;
  }
  iVar14 = derive_secret(tls->key_schedule,&tls->field_19,"c ap traffic");
  if (iVar14 != 0) {
    return iVar14;
  }
  iVar14 = derive_exporter_secret(tls,0);
  if (iVar14 != 0) {
    return iVar14;
  }
  bVar24 = tls->ctx->field_0xb8;
  if (tls->pending_handshake_secret == (uint8_t *)0x0) {
    if ((bVar24 & 8) != 0) {
      tls->state = PTLS_STATE_SERVER_EXPECT_CERTIFICATE;
      goto LAB_0011303f;
    }
  }
  else {
    if ((bVar24 & 0x10) == 0) {
      tls->state = PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA;
      goto LAB_0011303f;
    }
    iVar14 = commission_handshake_secret(tls);
    if (iVar14 != 0) {
      return iVar14;
    }
  }
  tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
LAB_0011303f:
  if ((tls->field_19).server.num_tickets_to_send != '\0') {
    if (tls->ctx->ticket_lifetime == 0) {
      __assert_fail("tls->ctx->ticket_lifetime != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                    0x1350,
                    "int server_finish_handshake(ptls_t *, ptls_message_emitter_t *, int, struct st_ptls_signature_algorithms_t *)"
                   );
    }
    bVar29 = (tls->field_19).server.num_tickets_to_send != '\0';
    if (bVar29) {
      local_c8 = &tls->traffic_protection;
      bVar24 = 0;
      do {
        psVar17 = tls->key_schedule->hashes[0].ctx;
        psVar17 = (*psVar17->clone_)(psVar17);
        ppVar4 = tls->ctx;
        if (ppVar4->ticket_lifetime == 0) {
          __assert_fail("tls->ctx->ticket_lifetime != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                        ,0x755,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
        }
        local_c0 = psVar17;
        if (ppVar4->encrypt_ticket == (ptls_encrypt_ticket_t *)0x0) {
          __assert_fail("tls->ctx->encrypt_ticket != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                        ,0x756,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
        }
        local_138.base = local_b8;
        local_138.off = 0;
        local_138.capacity = 0x80;
        local_138._24_8_ = local_138._24_8_ & 0xffffffffffff0000;
        ppVar5 = emitter->buf;
        local_100 = (ptls_key_schedule_t *)ppVar5->off;
        if ((tls->pending_handshake_secret == (uint8_t *)0x0) || ((ppVar4->field_0xb8 & 0x10) != 0))
        {
LAB_001131ad:
          ppVar5 = emitter->buf;
          local_110 = (ptls_context_t *)tls->key_schedule;
          sVar27 = ppVar5->off;
          iVar14 = ptls_buffer_reserve_aligned(ppVar5,1,'\0');
          if (iVar14 == 0) {
            ppVar5->base[ppVar5->off] = '\x14';
            ppVar5->off = ppVar5->off + 1;
            iVar14 = 0;
          }
          iVar16 = 6;
          if (iVar14 == 0) {
            iVar14 = ptls_buffer_reserve_aligned(ppVar5,3,'\0');
            if (iVar14 == 0) {
              puVar23 = ppVar5->base;
              sVar22 = ppVar5->off;
              puVar23[sVar22 + 2] = '\0';
              puVar23 = puVar23 + sVar22;
              puVar23[0] = '\0';
              puVar23[1] = '\0';
              ppVar5->off = ppVar5->off + 3;
              iVar14 = 0;
            }
            if (iVar14 == 0) {
              local_108 = (uint8_t *)ppVar5->off;
              iVar14 = ptls_buffer_reserve_aligned
                                 (emitter->buf,(tls->key_schedule->hashes[0].algo)->digest_size,'\0'
                                 );
              puVar23 = local_108;
              if (iVar14 == 0) {
                secret = (anon_struct_208_2_4e55c0bb_for_traffic_protection *)
                         tls->pending_handshake_secret;
                if ((anon_struct_208_2_4e55c0bb_for_traffic_protection *)
                    tls->pending_handshake_secret ==
                    (anon_struct_208_2_4e55c0bb_for_traffic_protection *)0x0) {
                  secret = local_c8;
                }
                iVar14 = calc_verify_data(emitter->buf->base + emitter->buf->off,tls->key_schedule,
                                          secret);
                if (iVar14 == 0) {
                  psVar1 = &emitter->buf->off;
                  *psVar1 = *psVar1 + (tls->key_schedule->hashes[0].algo)->digest_size;
                  uVar19 = ppVar5->off - (long)puVar23;
                  if (0xffffff < uVar19) {
                    iVar14 = 0x20c;
                    goto LAB_00113231;
                  }
                  lVar21 = 0x10;
                  do {
                    (ppVar5->base + -3)[(long)puVar23] = (uint8_t)(uVar19 >> ((byte)lVar21 & 0x3f));
                    lVar21 = lVar21 + -8;
                    puVar23 = puVar23 + 1;
                    iVar16 = 0;
                    bVar12 = true;
                    iVar14 = 0;
                  } while (lVar21 != -8);
                  goto LAB_00113317;
                }
              }
              bVar12 = false;
              iVar16 = 6;
            }
            else {
LAB_00113231:
              iVar16 = 6;
              bVar12 = false;
            }
LAB_00113317:
            if (bVar12) {
              iVar16 = 0;
              if ((local_110 != (ptls_context_t *)0x0) &&
                 (iVar16 = 0, (local_110->pre_shared_key).secret.len != 0)) {
                local_108 = ppVar5->base + sVar27;
                sVar22 = ppVar5->off;
                paVar25 = &local_110->ech;
                sVar26 = 0;
                do {
                  psVar17 = (st_ptls_hash_context_t *)(paVar25->client).ciphers;
                  (*psVar17->update)(psVar17,local_108,sVar22 - sVar27);
                  sVar26 = sVar26 + 1;
                  paVar25 = (anon_struct_40_2_b6104b7a_for_ech *)&(paVar25->server).retry_configs;
                } while (sVar26 != (local_110->pre_shared_key).secret.len);
                iVar16 = 0;
              }
            }
          }
          if (iVar16 == 0) {
            emitter->buf->off = (size_t)local_100;
            iVar16 = 0;
          }
        }
        else {
          if (tls->state != PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
            __assert_fail("tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA",
                          "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                          ,0x75d,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
          }
          local_110 = (ptls_context_t *)tls->key_schedule;
          iVar14 = ptls_buffer_reserve_aligned(ppVar5,1,'\0');
          if (iVar14 == 0) {
            ppVar5->base[ppVar5->off] = '\x05';
            ppVar5->off = ppVar5->off + 1;
            iVar14 = 0;
          }
          iVar16 = 6;
          if (iVar14 == 0) {
            iVar15 = ptls_buffer_reserve_aligned(ppVar5,3,'\0');
            if (iVar15 == 0) {
              puVar23 = ppVar5->base;
              sVar27 = ppVar5->off;
              puVar23[sVar27 + 2] = '\0';
              puVar23 = puVar23 + sVar27;
              puVar23[0] = '\0';
              puVar23[1] = '\0';
              ppVar5->off = ppVar5->off + 3;
              iVar15 = 0;
            }
            iVar16 = 6;
            iVar14 = iVar15;
            if (iVar15 == 0) {
              sVar27 = ppVar5->off;
              lVar21 = -3;
              do {
                ppVar5->base[lVar21 + sVar27] = '\0';
                lVar21 = lVar21 + 1;
              } while (lVar21 != 0);
              iVar16 = 0;
              iVar14 = 0;
            }
            if (iVar15 == 0) {
              iVar16 = 0;
              if ((local_110 != (ptls_context_t *)0x0) &&
                 (iVar16 = 0, (local_110->pre_shared_key).secret.len != 0)) {
                local_108 = local_100->secret + (long)(ppVar5->base + -4);
                sVar22 = ppVar5->off - (long)local_100;
                paVar25 = &local_110->ech;
                sVar27 = 0;
                do {
                  psVar17 = (st_ptls_hash_context_t *)(paVar25->client).ciphers;
                  (*psVar17->update)(psVar17,local_108,sVar22);
                  sVar27 = sVar27 + 1;
                  paVar25 = (anon_struct_40_2_b6104b7a_for_ech *)&(paVar25->server).retry_configs;
                } while (sVar27 != (local_110->pre_shared_key).secret.len);
                iVar16 = 0;
              }
            }
          }
          if (iVar16 == 0) {
            emitter->buf->off = (size_t)local_100;
            goto LAB_001131ad;
          }
        }
        if (iVar16 == 6) {
LAB_00113d9e:
          puVar23 = local_138.base;
          (*ptls_clear_memory)(local_138.base,local_138.off);
          if (local_138.is_allocated != '\0') {
            free(puVar23);
          }
          local_138.off = 0;
          local_138.is_allocated = '\0';
          local_138.align_bits = '\0';
          local_138._26_6_ = 0;
          local_138.base = (uint8_t *)0x0;
          local_138.capacity = 0;
          psVar17 = tls->key_schedule->hashes[0].ctx;
          (*psVar17->final)(psVar17,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
          tls->key_schedule->hashes[0].ctx = local_c0;
        }
        else if (iVar16 == 0) {
          (*tls->ctx->random_bytes)(&local_f4,4);
          if (tls->key_share != (ptls_key_exchange_algorithm_t *)0x0) {
            local_110 = tls->ctx;
            ppVar6 = tls->key_schedule;
            local_100 = (ptls_key_schedule_t *)CONCAT44(local_100._4_4_,local_f4);
            local_f0 = tls->server_name;
            uVar2 = tls->key_share->id;
            local_108 = (uint8_t *)CONCAT62(local_108._2_6_,tls->cipher_suite->id);
            __s = tls->negotiated_protocol;
            iVar14 = ptls_buffer_reserve_aligned(&local_138,2,'\0');
            if (iVar14 == 0) {
              (local_138.base + local_138.off)[0] = '\0';
              (local_138.base + local_138.off)[1] = '\0';
              local_138.off = local_138.off + 2;
              iVar14 = 0;
            }
            if (iVar14 == 0) {
              local_e0 = local_138.off;
              iVar14 = ptls_buffer_reserve_aligned(&local_138,8,'\0');
              if (iVar14 == 0) {
                builtin_memcpy(local_138.base + local_138.off,"ptls0001",8);
                local_138.off = local_138.off + 8;
                iVar14 = 0;
              }
              if (iVar14 == 0) {
                uVar18 = (*local_110->get_time->cb)(local_110->get_time);
                iVar14 = ptls_buffer_reserve_aligned(&local_138,8,'\0');
                if (iVar14 == 0) {
                  *(uint64_t *)(local_138.base + local_138.off) =
                       uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
                       (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
                       (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
                       (uVar18 & 0xff00) << 0x28 | uVar18 << 0x38;
                  local_138.off = local_138.off + 8;
                  iVar14 = 0;
                }
                if (iVar14 == 0) {
                  iVar14 = ptls_buffer_reserve_aligned(&local_138,2,'\0');
                  if (iVar14 == 0) {
                    (local_138.base + local_138.off)[0] = '\0';
                    (local_138.base + local_138.off)[1] = '\0';
                    local_138.off = local_138.off + 2;
                    iVar14 = 0;
                  }
                  if (iVar14 == 0) {
                    local_e8 = local_138.off;
                    iVar14 = ptls_buffer_reserve_aligned
                                       (&local_138,(ppVar6->hashes[0].algo)->digest_size,'\0');
                    if (iVar14 == 0) {
                      local_d0 = local_138.off;
                      local_d8 = local_138.base;
                      iVar14 = derive_resumption_secret
                                         (ppVar6,local_138.base + local_138.off,
                                          (ptls_iovec_t)ZEXT816(0));
                      if (iVar14 == 0) {
                        local_138.off = local_d0 + (ppVar6->hashes[0].algo)->digest_size;
                        if (0xffff < local_138.off - local_e8) {
                          iVar14 = 0x20c;
                          goto LAB_0011351f;
                        }
                        puVar23 = local_d8 + (local_e8 - 2);
                        lVar21 = 8;
                        do {
                          *puVar23 = (uint8_t)(local_138.off - local_e8 >> ((byte)lVar21 & 0x3f));
                          lVar21 = lVar21 + -8;
                          puVar23 = puVar23 + 1;
                          iVar14 = 0;
                          bVar12 = true;
                        } while (lVar21 != -8);
                        goto LAB_001135e5;
                      }
                    }
                    bVar12 = false;
                  }
                  else {
LAB_0011351f:
                    bVar12 = false;
                  }
LAB_001135e5:
                  if (bVar12) {
                    iVar14 = ptls_buffer_reserve_aligned(&local_138,2,'\0');
                    if (iVar14 == 0) {
                      *(ushort *)(local_138.base + local_138.off) = uVar2 << 8 | uVar2 >> 8;
                      local_138.off = local_138.off + 2;
                      iVar14 = 0;
                    }
                    if (iVar14 == 0) {
                      iVar14 = ptls_buffer_reserve_aligned(&local_138,2,'\0');
                      if (iVar14 == 0) {
                        *(ushort *)(local_138.base + local_138.off) =
                             (ushort)local_108 << 8 | (ushort)local_108 >> 8;
                        local_138.off = local_138.off + 2;
                        iVar14 = 0;
                      }
                      if (iVar14 == 0) {
                        iVar14 = ptls_buffer_reserve_aligned(&local_138,4,'\0');
                        if (iVar14 == 0) {
                          *(uint *)(local_138.base + local_138.off) =
                               (uint)local_100 >> 0x18 | ((uint)local_100 & 0xff0000) >> 8 |
                               ((uint)local_100 & 0xff00) << 8 | (uint)local_100 << 0x18;
                          local_138.off = local_138.off + 4;
                          iVar14 = 0;
                        }
                        if (iVar14 == 0) {
                          iVar14 = ptls_buffer_reserve_aligned(&local_138,2,'\0');
                          src = local_f0;
                          if (iVar14 == 0) {
                            (local_138.base + local_138.off)[0] = '\0';
                            (local_138.base + local_138.off)[1] = '\0';
                            local_138.off = local_138.off + 2;
                            iVar14 = 0;
                          }
                          sVar27 = local_138.off;
                          if (iVar14 == 0) {
                            if (((local_110->ticket_context).field_0x20 & 1) == 0) {
                              if (local_f0 != (char *)0x0) {
                                sVar20 = strlen(local_f0);
                                iVar14 = ptls_buffer__do_pushv(&local_138,src,sVar20);
                                goto joined_r0x00113cb3;
                              }
                            }
                            else {
                              iVar14 = ptls_buffer_reserve_aligned(&local_138,0x20,'\0');
                              if (iVar14 == 0) {
                                uVar9 = *(undefined8 *)(local_110->ticket_context).bytes;
                                uVar10 = *(undefined8 *)((local_110->ticket_context).bytes + 8);
                                uVar11 = *(undefined8 *)((local_110->ticket_context).bytes + 0x18);
                                *(undefined8 *)(local_138.base + local_138.off + 0x10) =
                                     *(undefined8 *)((local_110->ticket_context).bytes + 0x10);
                                *(undefined8 *)(local_138.base + local_138.off + 0x10 + 8) = uVar11;
                                *(undefined8 *)(local_138.base + local_138.off) = uVar9;
                                *(undefined8 *)(local_138.base + local_138.off + 8) = uVar10;
                                local_138.off = local_138.off + 0x20;
                                iVar14 = 0;
                              }
joined_r0x00113cb3:
                              if (iVar14 != 0) goto LAB_001136f3;
                            }
                            uVar19 = local_138.off - sVar27;
                            if (0xffff < uVar19) {
                              iVar14 = 0x20c;
                              goto LAB_001136f3;
                            }
                            puVar23 = local_138.base + (sVar27 - 2);
                            lVar21 = 8;
                            do {
                              *puVar23 = (uint8_t)(uVar19 >> ((byte)lVar21 & 0x3f));
                              lVar21 = lVar21 + -8;
                              puVar23 = puVar23 + 1;
                            } while (lVar21 != -8);
                            iVar14 = 0;
                            bVar12 = true;
                          }
                          else {
LAB_001136f3:
                            bVar12 = false;
                          }
                          if (bVar12) {
                            iVar16 = ptls_buffer_reserve_aligned(&local_138,1,'\0');
                            if (iVar16 == 0) {
                              local_138.base[local_138.off] = '\0';
                              local_138.off = local_138.off + 1;
                              iVar16 = 0;
                            }
                            sVar27 = local_138.off;
                            if (iVar16 == 0) {
                              if (__s != (char *)0x0) {
                                sVar20 = strlen(__s);
                                iVar16 = ptls_buffer__do_pushv(&local_138,__s,sVar20);
                                if (iVar16 != 0) goto LAB_00113737;
                              }
                              uVar19 = local_138.off - sVar27;
                              iVar16 = 0;
                              if (0xff < uVar19) {
                                iVar16 = 0x20c;
                                goto LAB_00113737;
                              }
                              local_138.base[sVar27 - 1] = (uint8_t)uVar19;
                              bVar12 = true;
                            }
                            else {
LAB_00113737:
                              bVar12 = false;
                            }
                            iVar14 = iVar16;
                            if (bVar12) {
                              iVar14 = 0x20c;
                              if (local_138.off - local_e0 < 0x10000) {
                                puVar23 = local_138.base + (local_e0 - 2);
                                lVar21 = 8;
                                do {
                                  *puVar23 = (uint8_t)(local_138.off - local_e0 >>
                                                      ((byte)lVar21 & 0x3f));
                                  lVar21 = lVar21 + -8;
                                  puVar23 = puVar23 + 1;
                                  iVar14 = iVar16;
                                } while (lVar21 != -8);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            if (iVar14 != 0) goto LAB_00113d9e;
          }
          iVar14 = (*emitter->begin_message)(emitter);
          if (iVar14 == 0) {
            ppVar5 = emitter->buf;
            local_100 = tls->key_schedule;
            local_108 = (uint8_t *)ppVar5->off;
            iVar14 = ptls_buffer_reserve_aligned(ppVar5,1,'\0');
            if (iVar14 == 0) {
              ppVar5->base[ppVar5->off] = '\x04';
              ppVar5->off = ppVar5->off + 1;
              iVar14 = 0;
            }
            local_140 = 6;
            if (iVar14 == 0) {
              iVar14 = ptls_buffer_reserve_aligned(ppVar5,3,'\0');
              if (iVar14 == 0) {
                puVar23 = ppVar5->base;
                sVar27 = ppVar5->off;
                puVar23[sVar27 + 2] = '\0';
                puVar23 = puVar23 + sVar27;
                puVar23[0] = '\0';
                puVar23[1] = '\0';
                ppVar5->off = ppVar5->off + 3;
                iVar14 = 0;
              }
              local_140 = 6;
              if (iVar14 == 0) {
                local_110 = (ptls_context_t *)ppVar5->off;
                uVar3 = tls->ctx->ticket_lifetime;
                ppVar7 = emitter->buf;
                iVar14 = ptls_buffer_reserve_aligned(ppVar7,4,'\0');
                uVar13 = local_f4;
                if (iVar14 == 0) {
                  *(uint *)(ppVar7->base + ppVar7->off) =
                       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                       uVar3 << 0x18;
                  ppVar7->off = ppVar7->off + 4;
                  iVar14 = 0;
                }
                local_140 = 6;
                if (iVar14 == 0) {
                  ppVar7 = emitter->buf;
                  iVar14 = ptls_buffer_reserve_aligned(ppVar7,4,'\0');
                  if (iVar14 == 0) {
                    *(uint *)(ppVar7->base + ppVar7->off) =
                         uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                         uVar13 << 0x18;
                    ppVar7->off = ppVar7->off + 4;
                    iVar14 = 0;
                  }
                  local_140 = 6;
                  if (iVar14 == 0) {
                    ppVar7 = emitter->buf;
                    iVar14 = ptls_buffer_reserve_aligned(ppVar7,1,'\0');
                    if (iVar14 == 0) {
                      ppVar7->base[ppVar7->off] = '\0';
                      ppVar7->off = ppVar7->off + 1;
                      iVar14 = 0;
                    }
                    local_140 = 6;
                    if (iVar14 == 0) {
                      emitter->buf->base[emitter->buf->off - 1] = '\0';
                      ppVar7 = emitter->buf;
                      iVar14 = ptls_buffer_reserve_aligned(ppVar7,2,'\0');
                      if (iVar14 == 0) {
                        puVar23 = ppVar7->base;
                        sVar27 = ppVar7->off;
                        (puVar23 + sVar27)[0] = '\0';
                        (puVar23 + sVar27)[1] = '\0';
                        ppVar7->off = ppVar7->off + 2;
                        iVar14 = 0;
                      }
                      local_140 = 6;
                      if (iVar14 == 0) {
                        sVar27 = emitter->buf->off;
                        psVar8 = tls->ctx->encrypt_ticket;
                        pVar30.len = local_138.off;
                        pVar30.base = local_138.base;
                        iVar14 = (*psVar8->cb)(psVar8,tls,1,emitter->buf,pVar30);
                        if (iVar14 != 0) goto LAB_00113a89;
                        uVar19 = emitter->buf->off - sVar27;
                        if (0xffff < uVar19) {
                          iVar14 = 0x20c;
                          goto LAB_00113a89;
                        }
                        lVar21 = 8;
                        do {
                          emitter->buf->base[sVar27 - 2] =
                               (uint8_t)(uVar19 >> ((byte)lVar21 & 0x3f));
                          lVar21 = lVar21 + -8;
                          sVar27 = sVar27 + 1;
                        } while (lVar21 != -8);
                        local_140 = 0;
                        bVar12 = true;
                        iVar14 = 0;
                      }
                      else {
LAB_00113a89:
                        bVar12 = false;
                      }
                      if (bVar12) {
                        ppVar7 = emitter->buf;
                        iVar14 = ptls_buffer_reserve_aligned(ppVar7,2,'\0');
                        if (iVar14 == 0) {
                          puVar23 = ppVar7->base;
                          sVar27 = ppVar7->off;
                          (puVar23 + sVar27)[0] = '\0';
                          (puVar23 + sVar27)[1] = '\0';
                          ppVar7->off = ppVar7->off + 2;
                          iVar14 = 0;
                        }
                        local_140 = 6;
                        if (iVar14 == 0) {
                          ppVar7 = emitter->buf;
                          sVar27 = ppVar7->off;
                          if (tls->ctx->max_early_data_size == 0) {
                            iVar16 = 0;
LAB_00113e46:
                            uVar19 = emitter->buf->off - sVar27;
                            local_140 = 6;
                            iVar14 = 0x20c;
                            if (uVar19 < 0x10000) {
                              lVar21 = 8;
                              do {
                                emitter->buf->base[sVar27 - 2] =
                                     (uint8_t)(uVar19 >> ((byte)lVar21 & 0x3f));
                                lVar21 = lVar21 + -8;
                                sVar27 = sVar27 + 1;
                              } while (lVar21 != -8);
                              local_140 = 0;
                              iVar14 = iVar16;
                            }
                          }
                          else {
                            iVar14 = ptls_buffer_reserve_aligned(ppVar7,2,'\0');
                            if (iVar14 == 0) {
                              puVar23 = ppVar7->base;
                              sVar22 = ppVar7->off;
                              (puVar23 + sVar22)[0] = '\0';
                              (puVar23 + sVar22)[1] = '*';
                              ppVar7->off = ppVar7->off + 2;
                              iVar14 = 0;
                            }
                            local_140 = 6;
                            if (iVar14 == 0) {
                              ppVar7 = emitter->buf;
                              iVar16 = ptls_buffer_reserve_aligned(ppVar7,2,'\0');
                              if (iVar16 == 0) {
                                puVar23 = ppVar7->base;
                                sVar22 = ppVar7->off;
                                (puVar23 + sVar22)[0] = '\0';
                                (puVar23 + sVar22)[1] = '\0';
                                ppVar7->off = ppVar7->off + 2;
                                iVar16 = 0;
                              }
                              local_140 = 6;
                              if (iVar16 == 0) {
                                ppVar7 = emitter->buf;
                                sVar22 = ppVar7->off;
                                local_f0 = (char *)CONCAT44(local_f0._4_4_,
                                                            tls->ctx->max_early_data_size);
                                iVar14 = ptls_buffer_reserve_aligned(ppVar7,4,'\0');
                                if (iVar14 == 0) {
                                  *(uint *)(ppVar7->base + ppVar7->off) =
                                       (uint)local_f0 >> 0x18 | ((uint)local_f0 & 0xff0000) >> 8 |
                                       ((uint)local_f0 & 0xff00) << 8 | (uint)local_f0 << 0x18;
                                  ppVar7->off = ppVar7->off + 4;
                                  iVar14 = 0;
                                }
                                if (iVar14 == 0) {
                                  uVar19 = emitter->buf->off - sVar22;
                                  iVar16 = 0x20c;
                                  if (uVar19 < 0x10000) {
                                    lVar21 = 8;
                                    do {
                                      emitter->buf->base[sVar22 - 2] =
                                           (uint8_t)(uVar19 >> ((byte)lVar21 & 0x3f));
                                      lVar21 = lVar21 + -8;
                                      sVar22 = sVar22 + 1;
                                    } while (lVar21 != -8);
                                    local_140 = 0;
                                    iVar16 = iVar14;
                                  }
                                }
                                else {
                                  local_140 = 6;
                                  iVar16 = iVar14;
                                }
                              }
                              iVar14 = iVar16;
                              if (local_140 == 0) goto LAB_00113e46;
                            }
                          }
                        }
                        if (local_140 == 0) {
                          uVar19 = ppVar5->off - (long)local_110;
                          if (uVar19 < 0x1000000) {
                            lVar21 = 0x10;
                            do {
                              (&local_110[-1].field_0x13d)[(long)ppVar5->base] =
                                   (char)(uVar19 >> ((byte)lVar21 & 0x3f));
                              lVar21 = lVar21 + -8;
                              local_110 = (ptls_context_t *)((long)&local_110->random_bytes + 1);
                            } while (lVar21 != -8);
                            local_140 = 0;
                          }
                          else {
                            iVar14 = 0x20c;
                            local_140 = 6;
                          }
                        }
                      }
                    }
                  }
                }
              }
              ppVar6 = local_100;
              if ((local_140 == 0) && (local_140 = 0, local_100 != (ptls_key_schedule_t *)0x0)) {
                if (local_100->num_hashes != 0) {
                  local_110 = (ptls_context_t *)(ppVar5->base + (long)local_108);
                  local_108 = (uint8_t *)(ppVar5->off - (long)local_108);
                  pppVar28 = &local_100->hashes[0].ctx;
                  sVar27 = 0;
                  do {
                    (*(*pppVar28)->update)(*pppVar28,local_110,(size_t)local_108);
                    sVar27 = sVar27 + 1;
                    pppVar28 = pppVar28 + 3;
                  } while (sVar27 != ppVar6->num_hashes);
                }
                local_140 = 0;
              }
            }
            if ((local_140 == 0) &&
               (iVar14 = (*emitter->commit_message)(emitter), local_140 = iVar14, iVar14 != 0)) {
              local_140 = 6;
            }
          }
          else {
            local_140 = 6;
          }
          if ((local_140 == 6) || (local_140 == 0)) goto LAB_00113d9e;
        }
        if (iVar14 != 0) goto LAB_00113f36;
        bVar24 = bVar24 + 1;
        bVar29 = bVar24 < (tls->field_19).server.num_tickets_to_send;
      } while (bVar29);
    }
    iVar14 = 0;
LAB_00113f36:
    if (bVar29) {
      return iVar14;
    }
  }
  iVar14 = 0x202;
  if ((tls->ctx->field_0xb8 & 8) == 0) {
    iVar14 = 0;
  }
  return iVar14;
}

Assistant:

static int server_finish_handshake(ptls_t *tls, ptls_message_emitter_t *emitter, int send_cert_verify,
                                   struct st_ptls_signature_algorithms_t *signature_algorithms)
{
    int ret;

    if (send_cert_verify) {
        if ((ret = send_certificate_verify(tls, emitter, signature_algorithms, PTLS_SERVER_CERTIFICATE_VERIFY_CONTEXT_STRING)) !=
            0) {
            if (ret == PTLS_ERROR_ASYNC_OPERATION) {
                tls->state = PTLS_STATE_SERVER_GENERATING_CERTIFICATE_VERIFY;
            }
            goto Exit;
        }
    }

    if ((ret = send_finished(tls, emitter)) != 0)
        goto Exit;

    assert(tls->key_schedule->generation == 2);
    if ((ret = key_schedule_extract(tls->key_schedule, ptls_iovec_init(NULL, 0))) != 0)
        goto Exit;
    if ((ret = setup_traffic_protection(tls, 1, "s ap traffic", 3, 0, 0)) != 0)
        goto Exit;
    if ((ret = derive_secret(tls->key_schedule, tls->server.pending_traffic_secret, "c ap traffic")) != 0)
        goto Exit;
    if ((ret = derive_exporter_secret(tls, 0)) != 0)
        goto Exit;

    if (tls->pending_handshake_secret != NULL) {
        if (tls->ctx->omit_end_of_early_data) {
            if ((ret = commission_handshake_secret(tls)) != 0)
                goto Exit;
            tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
        } else {
            tls->state = PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA;
        }
    } else if (tls->ctx->require_client_authentication) {
        tls->state = PTLS_STATE_SERVER_EXPECT_CERTIFICATE;
    } else {
        tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
    }

    /* send session ticket if necessary */
    if (tls->server.num_tickets_to_send != 0) {
        assert(tls->ctx->ticket_lifetime != 0);
        for (uint8_t i = 0; i < tls->server.num_tickets_to_send; ++i)
            if ((ret = send_session_ticket(tls, emitter)) != 0)
                goto Exit;
    }

    if (tls->ctx->require_client_authentication) {
        ret = PTLS_ERROR_IN_PROGRESS;
    } else {
        ret = 0;
    }

Exit:
    return ret;
}